

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exr_io.cpp
# Opt level: O2

void LoadEXR_RGB(float **rgb,int *width,int *height,char *filename)

{
  float *pfVar1;
  float *in_RAX;
  float *pfVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  float *rgba;
  
  rgba = in_RAX;
  LoadEXR_RGBA(&rgba,width,height,filename);
  iVar5 = *width;
  iVar7 = *height;
  uVar6 = 0xffffffffffffffff;
  if (-1 < iVar7 * iVar5) {
    uVar6 = (long)(iVar7 * iVar5 * 3) << 2;
  }
  pfVar2 = (float *)operator_new__(uVar6);
  *rgb = pfVar2;
  lVar3 = 0;
  pfVar2 = rgba;
  for (lVar4 = 0; lVar4 < iVar7 * iVar5; lVar4 = lVar4 + 1) {
    pfVar1 = *rgb;
    *(float *)((long)pfVar1 + lVar3 + 8) = pfVar2[2];
    *(undefined8 *)((long)pfVar1 + lVar3) = *(undefined8 *)pfVar2;
    iVar5 = *width;
    iVar7 = *height;
    pfVar2 = pfVar2 + 4;
    lVar3 = lVar3 + 0xc;
  }
  free(rgba);
  return;
}

Assistant:

void LoadEXR_RGB(float** rgb, int* width, int* height, const char* filename)
{
  float* rgba;
  LoadEXR_RGBA(&rgba, width, height, filename);
  *rgb = new float[(*width)*(*height)*3];
  for (int i=0; i<(*width)*(*height); ++i) {
    memcpy(*rgb + 3*i, rgba + 4*i, 3 * sizeof(float));
  }
  free(rgba);
}